

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

bool primesum::test(void)

{
  double dVar1;
  undefined1 x_14 [16];
  undefined1 x_15 [16];
  int256_t res1;
  int256_t res1_00;
  int256_t res1_01;
  int256_t res1_02;
  int256_t res1_03;
  int256_t res1_04;
  int256_t res1_05;
  int256_t res1_06;
  int256_t res1_07;
  int256_t res1_08;
  int256_t res1_09;
  int256_t res1_10;
  int256_t res1_11;
  int256_t res1_12;
  int256_t res2;
  int256_t res2_00;
  int256_t res2_01;
  int256_t res2_02;
  int256_t res2_03;
  int256_t res2_04;
  int256_t res2_05;
  int256_t res2_06;
  int256_t res2_07;
  int256_t res2_08;
  int256_t res2_09;
  int256_t res2_10;
  int256_t res2_11;
  int256_t res2_12;
  undefined1 x_16 [16];
  undefined1 x_17 [16];
  undefined1 x_18 [16];
  undefined1 x_19 [16];
  undefined1 x_20 [16];
  undefined1 x_21 [16];
  undefined1 x_22 [16];
  undefined1 x_23 [16];
  undefined1 x_24 [16];
  undefined1 x_25 [16];
  long lVar2;
  int iVar3;
  int iVar4;
  time_t tVar5;
  ostream *poVar6;
  int64_t iVar7;
  ostream *poVar8;
  ostream *poVar9;
  long lVar10;
  exception *e;
  double percent_6;
  int64_t i_6;
  int64_t x_12;
  int64_t x_13;
  double percent_5;
  int64_t i_5;
  int64_t x_10;
  int64_t x_11;
  double percent_4;
  int64_t i_4;
  int64_t x_8;
  int64_t x_9;
  double percent_3;
  int64_t i_3;
  int64_t x_6;
  int64_t x_7;
  double percent_2;
  int64_t i_2;
  int64_t x_4;
  int64_t x_5;
  double percent_1;
  int64_t i_1;
  int64_t x_2;
  int64_t x_3;
  double percent;
  int64_t i;
  int64_t x;
  int64_t x_1;
  undefined8 in_stack_fffffffffffff3d8;
  undefined8 in_stack_fffffffffffff3e0;
  allocator<char> *in_stack_fffffffffffff410;
  char *in_stack_fffffffffffff418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff420;
  int64_t in_stack_fffffffffffff458;
  int64_t in_stack_fffffffffffff5a8;
  int64_t in_stack_fffffffffffff5d8;
  int64_t in_stack_fffffffffffff638;
  string *in_stack_fffffffffffff640;
  allocator<char> *in_stack_fffffffffffff650;
  int64_t in_stack_fffffffffffff658;
  long in_stack_fffffffffffff660;
  int64_t in_stack_fffffffffffff668;
  allocator<char> *in_stack_fffffffffffff670;
  undefined4 in_stack_fffffffffffff678;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffff67c;
  undefined8 in_stack_fffffffffffff680;
  undefined8 in_stack_fffffffffffff688;
  undefined8 in_stack_fffffffffffff6a0;
  undefined8 in_stack_fffffffffffff6a8;
  int64_t in_stack_fffffffffffff6b8;
  long in_stack_fffffffffffff6c0;
  int64_t in_stack_fffffffffffff6c8;
  allocator<char> *paStack_7c0;
  allocator<char> local_779;
  string local_778 [32];
  long local_758;
  long local_750;
  long local_748;
  long local_740;
  allocator<char> *paStack_720;
  long local_718;
  long local_710;
  allocator<char> local_6d9;
  string local_6d8 [32];
  long local_6b8;
  double local_6b0;
  undefined1 local_6a8 [32];
  long local_688;
  long local_680;
  allocator<char> local_649;
  string local_648 [32];
  long local_628;
  long local_620;
  undefined1 local_618 [32];
  long local_5f8;
  long local_5f0;
  allocator<char> local_5b9;
  string local_5b8 [32];
  long local_598;
  double local_590;
  undefined1 local_588 [32];
  int256_t local_568;
  allocator<char> local_539;
  string local_538 [32];
  long local_518;
  long local_510;
  undefined1 local_508 [32];
  int256_t local_4e8;
  allocator<char> local_4b9;
  string local_4b8 [32];
  long local_498;
  double local_490;
  undefined1 local_488 [32];
  int256_t local_468;
  allocator<char> local_439;
  string local_438 [32];
  long local_418;
  string *local_410;
  undefined1 local_408 [32];
  int256_t local_3e8;
  allocator<char> local_3b9;
  string local_3b8 [32];
  long local_398;
  double local_390;
  undefined1 local_388 [32];
  int256_t local_368;
  allocator<char> local_339;
  string local_338 [32];
  long local_318;
  long local_310;
  undefined1 local_308 [32];
  int256_t local_2e8;
  allocator<char> local_2b9;
  string local_2b8 [32];
  long local_298;
  double local_290;
  long local_288;
  long local_280;
  allocator<char> *paStack_260;
  int256_t local_258;
  allocator<char> local_229;
  string local_228 [32];
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  allocator<char> *paStack_1d0;
  int256_t local_1c8;
  allocator<char> local_199;
  string local_198 [32];
  long local_178;
  double local_170;
  int128_t *local_168;
  int128_t *local_158;
  undefined1 local_148 [32];
  long local_128;
  long local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  allocator<char> local_e9;
  string local_e8 [32];
  long local_c8;
  long local_c0;
  int128_t *local_b8;
  int128_t *local_a8;
  undefined1 local_98 [32];
  long local_78;
  long local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  allocator<char> local_41;
  string local_40 [32];
  long local_20;
  
  set_print(false);
  tVar5 = time((time_t *)0x0);
  srand((uint)tVar5);
  poVar6 = std::operator<<((ostream *)&std::cout,"Testing ");
  poVar6 = std::operator<<(poVar6,"pi_lmo1");
  poVar6 = std::operator<<(poVar6,"(x)");
  std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
  for (local_20 = 0; local_20 < 10000; local_20 = local_20 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff420,in_stack_fffffffffffff418,in_stack_fffffffffffff410);
    local_70 = local_20 >> 0x3f;
    local_78 = local_20;
    x_20._8_8_ = in_stack_fffffffffffff6a8;
    x_20._0_8_ = in_stack_fffffffffffff6a0;
    pi_lmo1((int128_t)x_20);
    local_b8 = prime_sum_tiny(in_stack_fffffffffffff458);
    x_14._8_8_ = in_stack_fffffffffffff3e0;
    x_14._0_8_ = in_stack_fffffffffffff3d8;
    local_a8 = local_b8;
    int256_t::int256_t<__int128,void>((int256_t *)local_98,(__int128)x_14);
    res1.low._8_8_ = in_stack_fffffffffffff658;
    res1.low._0_8_ = in_stack_fffffffffffff650;
    res1.high._0_8_ = in_stack_fffffffffffff660;
    res1.high._8_8_ = in_stack_fffffffffffff668;
    res2.low._8_4_ = in_stack_fffffffffffff678;
    res2.low._0_8_ = in_stack_fffffffffffff670;
    res2.low._12_4_ = in_stack_fffffffffffff67c;
    res2.high._0_8_ = in_stack_fffffffffffff680;
    res2.high._8_8_ = in_stack_fffffffffffff688;
    in_stack_fffffffffffff3d8 = local_68;
    in_stack_fffffffffffff3e0 = uStack_60;
    in_stack_fffffffffffff410 = (allocator<char> *)local_98._24_8_;
    anon_unknown.dwarf_6cf57::check_equal
              (in_stack_fffffffffffff640,in_stack_fffffffffffff638,res1,res2);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  local_c0 = 0;
  local_c8 = 0;
  while (local_c8 < 0x32) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff420,in_stack_fffffffffffff418,in_stack_fffffffffffff410);
    local_120 = local_c0 >> 0x3f;
    local_128 = local_c0;
    x_21._8_8_ = in_stack_fffffffffffff6a8;
    x_21._0_8_ = in_stack_fffffffffffff6a0;
    pi_lmo1((int128_t)x_21);
    local_168 = prime_sum_tiny(in_stack_fffffffffffff458);
    x_15._8_8_ = in_stack_fffffffffffff3e0;
    x_15._0_8_ = in_stack_fffffffffffff3d8;
    local_158 = local_168;
    int256_t::int256_t<__int128,void>((int256_t *)local_148,(__int128)x_15);
    res1_00.low._8_8_ = in_stack_fffffffffffff658;
    res1_00.low._0_8_ = in_stack_fffffffffffff650;
    res1_00.high._0_8_ = in_stack_fffffffffffff660;
    res1_00.high._8_8_ = in_stack_fffffffffffff668;
    res2_00.low._8_4_ = in_stack_fffffffffffff678;
    res2_00.low._0_8_ = in_stack_fffffffffffff670;
    res2_00.low._12_4_ = in_stack_fffffffffffff67c;
    res2_00.high._0_8_ = in_stack_fffffffffffff680;
    res2_00.high._8_8_ = in_stack_fffffffffffff688;
    in_stack_fffffffffffff3d8 = local_118;
    in_stack_fffffffffffff3e0 = uStack_110;
    in_stack_fffffffffffff410 = (allocator<char> *)local_148._24_8_;
    anon_unknown.dwarf_6cf57::check_equal
              (in_stack_fffffffffffff640,in_stack_fffffffffffff638,res1_00,res2_00);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
    local_170 = (((double)local_c8 + 1.0) * 100.0) / 50.0;
    poVar6 = std::operator<<((ostream *)&std::cout,"\rTesting ");
    poVar6 = std::operator<<(poVar6,"pi_lmo1(x) ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)local_170);
    poVar6 = std::operator<<(poVar6,"%");
    std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
    local_c8 = local_c8 + 1;
    iVar3 = anon_unknown.dwarf_6cf57::get_rand();
    local_c0 = iVar3 + local_c0;
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Testing ");
  poVar6 = std::operator<<(poVar6,"pi_lmo2");
  poVar6 = std::operator<<(poVar6,"(x)");
  std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
  for (local_178 = 0; local_178 < 10000; local_178 = local_178 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff420,in_stack_fffffffffffff418,in_stack_fffffffffffff410);
    iVar7 = pi_lmo2(in_stack_fffffffffffff5a8);
    int256_t::int256_t<long,void>(&local_1c8,iVar7);
    local_1f0 = local_178 >> 0x3f;
    local_1f8 = local_178;
    x_22._8_8_ = in_stack_fffffffffffff6a8;
    x_22._0_8_ = in_stack_fffffffffffff6a0;
    pi_lmo1((int128_t)x_22);
    res1_01.low._8_8_ = in_stack_fffffffffffff658;
    res1_01.low._0_8_ = in_stack_fffffffffffff650;
    res1_01.high._0_8_ = in_stack_fffffffffffff660;
    res1_01.high._8_8_ = in_stack_fffffffffffff668;
    res2_01.low._8_4_ = in_stack_fffffffffffff678;
    res2_01.low._0_8_ = in_stack_fffffffffffff670;
    res2_01.low._12_4_ = in_stack_fffffffffffff67c;
    res2_01.high._0_8_ = in_stack_fffffffffffff680;
    res2_01.high._8_8_ = in_stack_fffffffffffff688;
    in_stack_fffffffffffff410 = paStack_1d0;
    anon_unknown.dwarf_6cf57::check_equal
              (in_stack_fffffffffffff640,in_stack_fffffffffffff638,res1_01,res2_01);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator(&local_199);
  }
  local_200 = 0;
  local_208 = 0;
  while (local_208 < 100) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff420,in_stack_fffffffffffff418,in_stack_fffffffffffff410);
    iVar7 = pi_lmo2(in_stack_fffffffffffff5a8);
    int256_t::int256_t<long,void>(&local_258,iVar7);
    local_280 = local_200 >> 0x3f;
    local_288 = local_200;
    x_23._8_8_ = in_stack_fffffffffffff6a8;
    x_23._0_8_ = in_stack_fffffffffffff6a0;
    pi_lmo1((int128_t)x_23);
    res1_02.low._8_8_ = in_stack_fffffffffffff658;
    res1_02.low._0_8_ = in_stack_fffffffffffff650;
    res1_02.high._0_8_ = in_stack_fffffffffffff660;
    res1_02.high._8_8_ = in_stack_fffffffffffff668;
    res2_02.low._8_4_ = in_stack_fffffffffffff678;
    res2_02.low._0_8_ = in_stack_fffffffffffff670;
    res2_02.low._12_4_ = in_stack_fffffffffffff67c;
    res2_02.high._0_8_ = in_stack_fffffffffffff680;
    res2_02.high._8_8_ = in_stack_fffffffffffff688;
    in_stack_fffffffffffff410 = paStack_260;
    anon_unknown.dwarf_6cf57::check_equal
              (in_stack_fffffffffffff640,in_stack_fffffffffffff638,res1_02,res2_02);
    std::__cxx11::string::~string(local_228);
    std::allocator<char>::~allocator(&local_229);
    local_290 = (((double)local_208 + 1.0) * 100.0) / 100.0;
    poVar6 = std::operator<<((ostream *)&std::cout,"\rTesting ");
    poVar6 = std::operator<<(poVar6,"pi_lmo2(x) ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)local_290);
    poVar6 = std::operator<<(poVar6,"%");
    std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
    local_208 = local_208 + 1;
    iVar3 = anon_unknown.dwarf_6cf57::get_rand();
    local_200 = iVar3 + local_200;
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Testing ");
  poVar6 = std::operator<<(poVar6,"pi_lmo3");
  poVar6 = std::operator<<(poVar6,"(x)");
  std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
  for (local_298 = 0; local_298 < 10000; local_298 = local_298 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff420,in_stack_fffffffffffff418,in_stack_fffffffffffff410);
    iVar7 = pi_lmo3(in_stack_fffffffffffff5a8);
    int256_t::int256_t<long,void>(&local_2e8,iVar7);
    iVar7 = pi_lmo2(in_stack_fffffffffffff5a8);
    int256_t::int256_t<long,void>((int256_t *)local_308,iVar7);
    res1_03.low._8_8_ = in_stack_fffffffffffff658;
    res1_03.low._0_8_ = in_stack_fffffffffffff650;
    res1_03.high._0_8_ = in_stack_fffffffffffff660;
    res1_03.high._8_8_ = in_stack_fffffffffffff668;
    res2_03.low._8_4_ = in_stack_fffffffffffff678;
    res2_03.low._0_8_ = in_stack_fffffffffffff670;
    res2_03.low._12_4_ = in_stack_fffffffffffff67c;
    res2_03.high._0_8_ = in_stack_fffffffffffff680;
    res2_03.high._8_8_ = in_stack_fffffffffffff688;
    in_stack_fffffffffffff410 = (allocator<char> *)local_308._24_8_;
    anon_unknown.dwarf_6cf57::check_equal
              (in_stack_fffffffffffff640,in_stack_fffffffffffff638,res1_03,res2_03);
    std::__cxx11::string::~string(local_2b8);
    std::allocator<char>::~allocator(&local_2b9);
  }
  local_310 = 0;
  local_318 = 0;
  while (local_318 < 300) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff420,in_stack_fffffffffffff418,in_stack_fffffffffffff410);
    in_stack_fffffffffffff6c0 = local_310;
    in_stack_fffffffffffff6c8 = pi_lmo3(in_stack_fffffffffffff5a8);
    int256_t::int256_t<long,void>(&local_368,in_stack_fffffffffffff6c8);
    in_stack_fffffffffffff6b8 = pi_lmo2(in_stack_fffffffffffff5a8);
    int256_t::int256_t<long,void>((int256_t *)local_388,in_stack_fffffffffffff6b8);
    res1_04.low._8_8_ = in_stack_fffffffffffff658;
    res1_04.low._0_8_ = in_stack_fffffffffffff650;
    res1_04.high._0_8_ = in_stack_fffffffffffff660;
    res1_04.high._8_8_ = in_stack_fffffffffffff668;
    res2_04.low._8_4_ = in_stack_fffffffffffff678;
    res2_04.low._0_8_ = in_stack_fffffffffffff670;
    res2_04.low._12_4_ = in_stack_fffffffffffff67c;
    res2_04.high._0_8_ = in_stack_fffffffffffff680;
    res2_04.high._8_8_ = in_stack_fffffffffffff688;
    in_stack_fffffffffffff410 = (allocator<char> *)local_388._24_8_;
    anon_unknown.dwarf_6cf57::check_equal
              (in_stack_fffffffffffff640,in_stack_fffffffffffff638,res1_04,res2_04);
    std::__cxx11::string::~string(local_338);
    std::allocator<char>::~allocator(&local_339);
    local_390 = (((double)local_318 + 1.0) * 100.0) / 300.0;
    poVar6 = std::operator<<((ostream *)&std::cout,"\rTesting ");
    poVar6 = std::operator<<(poVar6,"pi_lmo3(x) ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)local_390);
    poVar6 = std::operator<<(poVar6,"%");
    std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
    local_318 = local_318 + 1;
    iVar3 = anon_unknown.dwarf_6cf57::get_rand();
    local_310 = iVar3 + local_310;
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"Testing ");
  poVar8 = std::operator<<(poVar6,"pi_lmo4");
  poVar9 = std::operator<<(poVar8,"(x)");
  uVar11 = SUB84(poVar9,0);
  iVar3 = (int)((ulong)poVar9 >> 0x20);
  std::ostream::operator<<(poVar9,std::flush<char,std::char_traits<char>>);
  for (local_398 = 0; local_398 < 10000; local_398 = local_398 + 1) {
    in_stack_fffffffffffff670 = &local_3b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff420,in_stack_fffffffffffff418,in_stack_fffffffffffff410);
    in_stack_fffffffffffff660 = local_398;
    in_stack_fffffffffffff668 = pi_lmo4(in_stack_fffffffffffff5d8);
    int256_t::int256_t<long,void>(&local_3e8,in_stack_fffffffffffff668);
    in_stack_fffffffffffff658 = pi_lmo3(in_stack_fffffffffffff5a8);
    int256_t::int256_t<long,void>((int256_t *)local_408,in_stack_fffffffffffff658);
    res1_05.low._8_8_ = in_stack_fffffffffffff658;
    res1_05.low._0_8_ = in_stack_fffffffffffff650;
    res1_05.high._0_8_ = in_stack_fffffffffffff660;
    res1_05.high._8_8_ = in_stack_fffffffffffff668;
    res2_05.low._8_4_ = uVar11;
    res2_05.low._0_8_ = in_stack_fffffffffffff670;
    res2_05.low._12_4_ = iVar3;
    res2_05.high._0_8_ = poVar8;
    res2_05.high._8_8_ = poVar6;
    in_stack_fffffffffffff410 = (allocator<char> *)local_408._24_8_;
    anon_unknown.dwarf_6cf57::check_equal
              (in_stack_fffffffffffff640,in_stack_fffffffffffff638,res1_05,res2_05);
    std::__cxx11::string::~string(local_3b8);
    std::allocator<char>::~allocator(&local_3b9);
  }
  local_410 = (string *)0x0;
  local_418 = 0;
  while (local_418 < 400) {
    in_stack_fffffffffffff650 = &local_439;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff420,in_stack_fffffffffffff418,in_stack_fffffffffffff410);
    in_stack_fffffffffffff640 = local_410;
    iVar7 = pi_lmo4(in_stack_fffffffffffff5d8);
    int256_t::int256_t<long,void>(&local_468,iVar7);
    in_stack_fffffffffffff638 = pi_lmo3(in_stack_fffffffffffff5a8);
    int256_t::int256_t<long,void>((int256_t *)local_488,in_stack_fffffffffffff638);
    res1_06.low._8_8_ = in_stack_fffffffffffff658;
    res1_06.low._0_8_ = in_stack_fffffffffffff650;
    res1_06.high._0_8_ = in_stack_fffffffffffff660;
    res1_06.high._8_8_ = in_stack_fffffffffffff668;
    res2_06.low._8_4_ = uVar11;
    res2_06.low._0_8_ = in_stack_fffffffffffff670;
    res2_06.low._12_4_ = iVar3;
    res2_06.high._0_8_ = poVar8;
    res2_06.high._8_8_ = poVar6;
    in_stack_fffffffffffff410 = (allocator<char> *)local_488._24_8_;
    anon_unknown.dwarf_6cf57::check_equal
              (in_stack_fffffffffffff640,in_stack_fffffffffffff638,res1_06,res2_06);
    std::__cxx11::string::~string(local_438);
    std::allocator<char>::~allocator(&local_439);
    local_490 = (((double)local_418 + 1.0) * 100.0) / 400.0;
    poVar9 = std::operator<<((ostream *)&std::cout,"\rTesting ");
    poVar9 = std::operator<<(poVar9,"pi_lmo4(x) ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)local_490);
    poVar9 = std::operator<<(poVar9,"%");
    std::ostream::operator<<(poVar9,std::flush<char,std::char_traits<char>>);
    local_418 = local_418 + 1;
    iVar4 = anon_unknown.dwarf_6cf57::get_rand();
    local_410 = (string *)(&local_410->_M_dataplus + iVar4);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,"Testing ");
  poVar9 = std::operator<<(poVar9,"pi_lmo5");
  poVar9 = std::operator<<(poVar9,"(x)");
  std::ostream::operator<<(poVar9,std::flush<char,std::char_traits<char>>);
  for (local_498 = 0; local_498 < 10000; local_498 = local_498 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff420,in_stack_fffffffffffff418,in_stack_fffffffffffff410);
    iVar7 = pi_lmo5(in_stack_fffffffffffff658);
    int256_t::int256_t<long,void>(&local_4e8,iVar7);
    in_stack_fffffffffffff5d8 = pi_lmo4(in_stack_fffffffffffff5d8);
    int256_t::int256_t<long,void>((int256_t *)local_508,in_stack_fffffffffffff5d8);
    res1_07.low._8_8_ = in_stack_fffffffffffff658;
    res1_07.low._0_8_ = in_stack_fffffffffffff650;
    res1_07.high._0_8_ = in_stack_fffffffffffff660;
    res1_07.high._8_8_ = in_stack_fffffffffffff668;
    res2_07.low._8_4_ = uVar11;
    res2_07.low._0_8_ = in_stack_fffffffffffff670;
    res2_07.low._12_4_ = iVar3;
    res2_07.high._0_8_ = poVar8;
    res2_07.high._8_8_ = poVar6;
    in_stack_fffffffffffff410 = (allocator<char> *)local_508._24_8_;
    anon_unknown.dwarf_6cf57::check_equal
              (in_stack_fffffffffffff640,in_stack_fffffffffffff638,res1_07,res2_07);
    std::__cxx11::string::~string(local_4b8);
    std::allocator<char>::~allocator(&local_4b9);
  }
  local_510 = 0;
  local_518 = 0;
  while (local_518 < 600) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff420,in_stack_fffffffffffff418,in_stack_fffffffffffff410);
    iVar7 = pi_lmo5(in_stack_fffffffffffff658);
    int256_t::int256_t<long,void>(&local_568,iVar7);
    iVar7 = pi_lmo4(in_stack_fffffffffffff5d8);
    int256_t::int256_t<long,void>((int256_t *)local_588,iVar7);
    res1_08.low._8_8_ = in_stack_fffffffffffff658;
    res1_08.low._0_8_ = in_stack_fffffffffffff650;
    res1_08.high._0_8_ = in_stack_fffffffffffff660;
    res1_08.high._8_8_ = in_stack_fffffffffffff668;
    res2_08.low._8_4_ = uVar11;
    res2_08.low._0_8_ = in_stack_fffffffffffff670;
    res2_08.low._12_4_ = iVar3;
    res2_08.high._0_8_ = poVar8;
    res2_08.high._8_8_ = poVar6;
    in_stack_fffffffffffff410 = (allocator<char> *)local_588._24_8_;
    anon_unknown.dwarf_6cf57::check_equal
              (in_stack_fffffffffffff640,in_stack_fffffffffffff638,res1_08,res2_08);
    std::__cxx11::string::~string(local_538);
    std::allocator<char>::~allocator(&local_539);
    local_590 = (((double)local_518 + 1.0) * 100.0) / 600.0;
    poVar9 = std::operator<<((ostream *)&std::cout,"\rTesting ");
    poVar9 = std::operator<<(poVar9,"pi_lmo5(x) ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)local_590);
    poVar9 = std::operator<<(poVar9,"%");
    std::ostream::operator<<(poVar9,std::flush<char,std::char_traits<char>>);
    local_518 = local_518 + 1;
    iVar4 = anon_unknown.dwarf_6cf57::get_rand();
    local_510 = iVar4 + local_510;
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,"Testing ");
  poVar9 = std::operator<<(poVar9,"pi_lmo_parallel1");
  poVar9 = std::operator<<(poVar9,"(x)");
  std::ostream::operator<<(poVar9,std::flush<char,std::char_traits<char>>);
  for (local_598 = 0; local_598 < 10000; local_598 = local_598 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff420,in_stack_fffffffffffff418,in_stack_fffffffffffff410);
    lVar2 = local_598;
    lVar10 = local_598 >> 0x3f;
    get_num_threads();
    local_5f8 = lVar2;
    x_16._8_8_ = poVar6;
    x_16._0_8_ = poVar8;
    local_5f0 = lVar10;
    pi_lmo_parallel1((int128_t)x_16,iVar3);
    iVar7 = pi_lmo5(in_stack_fffffffffffff658);
    int256_t::int256_t<long,void>((int256_t *)local_618,iVar7);
    res1_09.low._8_8_ = in_stack_fffffffffffff658;
    res1_09.low._0_8_ = in_stack_fffffffffffff650;
    res1_09.high._0_8_ = in_stack_fffffffffffff660;
    res1_09.high._8_8_ = in_stack_fffffffffffff668;
    res2_09.low._8_4_ = uVar11;
    res2_09.low._0_8_ = in_stack_fffffffffffff670;
    res2_09.low._12_4_ = iVar3;
    res2_09.high._0_8_ = poVar8;
    res2_09.high._8_8_ = poVar6;
    in_stack_fffffffffffff410 = (allocator<char> *)local_618._24_8_;
    anon_unknown.dwarf_6cf57::check_equal
              (in_stack_fffffffffffff640,in_stack_fffffffffffff638,res1_09,res2_09);
    std::__cxx11::string::~string(local_5b8);
    std::allocator<char>::~allocator(&local_5b9);
  }
  local_620 = 0;
  local_628 = 0;
  while (local_628 < 600) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff420,in_stack_fffffffffffff418,in_stack_fffffffffffff410);
    lVar2 = local_620;
    lVar10 = local_620 >> 0x3f;
    get_num_threads();
    local_688 = lVar2;
    x_17._8_8_ = poVar6;
    x_17._0_8_ = poVar8;
    local_680 = lVar10;
    pi_lmo_parallel1((int128_t)x_17,iVar3);
    iVar7 = pi_lmo5(in_stack_fffffffffffff658);
    int256_t::int256_t<long,void>((int256_t *)local_6a8,iVar7);
    res1_10.low._8_8_ = in_stack_fffffffffffff658;
    res1_10.low._0_8_ = in_stack_fffffffffffff650;
    res1_10.high._0_8_ = in_stack_fffffffffffff660;
    res1_10.high._8_8_ = in_stack_fffffffffffff668;
    res2_10.low._8_4_ = uVar11;
    res2_10.low._0_8_ = in_stack_fffffffffffff670;
    res2_10.low._12_4_ = iVar3;
    res2_10.high._0_8_ = poVar8;
    res2_10.high._8_8_ = poVar6;
    in_stack_fffffffffffff410 = (allocator<char> *)local_6a8._24_8_;
    anon_unknown.dwarf_6cf57::check_equal
              (in_stack_fffffffffffff640,in_stack_fffffffffffff638,res1_10,res2_10);
    std::__cxx11::string::~string(local_648);
    std::allocator<char>::~allocator(&local_649);
    local_6b0 = (((double)local_628 + 1.0) * 100.0) / 600.0;
    poVar9 = std::operator<<((ostream *)&std::cout,"\rTesting ");
    poVar9 = std::operator<<(poVar9,"pi_lmo_parallel1(x) ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)local_6b0);
    poVar9 = std::operator<<(poVar9,"%");
    std::ostream::operator<<(poVar9,std::flush<char,std::char_traits<char>>);
    local_628 = local_628 + 1;
    iVar4 = anon_unknown.dwarf_6cf57::get_rand();
    local_620 = iVar4 + local_620;
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,"Testing ");
  poVar9 = std::operator<<(poVar9,"pi_deleglise_rivat_parallel1");
  poVar9 = std::operator<<(poVar9,"(x)");
  std::ostream::operator<<(poVar9,std::flush<char,std::char_traits<char>>);
  for (local_6b8 = 0; local_6b8 < 10000; local_6b8 = local_6b8 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff420,in_stack_fffffffffffff418,in_stack_fffffffffffff410);
    lVar2 = local_6b8;
    lVar10 = local_6b8 >> 0x3f;
    get_num_threads();
    local_718 = lVar2;
    x_24._8_8_ = in_stack_fffffffffffff6c8;
    x_24._0_8_ = in_stack_fffffffffffff6c0;
    local_710 = lVar10;
    pi_deleglise_rivat_parallel1((int128_t)x_24,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
    lVar2 = local_6b8;
    lVar10 = local_6b8 >> 0x3f;
    get_num_threads();
    local_748 = lVar2;
    x_18._8_8_ = poVar6;
    x_18._0_8_ = poVar8;
    local_740 = lVar10;
    pi_lmo_parallel1((int128_t)x_18,iVar3);
    res1_11.low._8_8_ = in_stack_fffffffffffff658;
    res1_11.low._0_8_ = in_stack_fffffffffffff650;
    res1_11.high._0_8_ = in_stack_fffffffffffff660;
    res1_11.high._8_8_ = in_stack_fffffffffffff668;
    res2_11.low._8_4_ = uVar11;
    res2_11.low._0_8_ = in_stack_fffffffffffff670;
    res2_11.low._12_4_ = iVar3;
    res2_11.high._0_8_ = poVar8;
    res2_11.high._8_8_ = poVar6;
    in_stack_fffffffffffff410 = paStack_720;
    anon_unknown.dwarf_6cf57::check_equal
              (in_stack_fffffffffffff640,in_stack_fffffffffffff638,res1_11,res2_11);
    std::__cxx11::string::~string(local_6d8);
    std::allocator<char>::~allocator(&local_6d9);
  }
  local_750 = 0;
  local_758 = 0;
  while (local_758 < 900) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff420,in_stack_fffffffffffff418,in_stack_fffffffffffff410);
    get_num_threads();
    x_25._8_8_ = in_stack_fffffffffffff6c8;
    x_25._0_8_ = in_stack_fffffffffffff6c0;
    pi_deleglise_rivat_parallel1((int128_t)x_25,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
    get_num_threads();
    x_19._8_8_ = poVar6;
    x_19._0_8_ = poVar8;
    pi_lmo_parallel1((int128_t)x_19,iVar3);
    res1_12.low._8_8_ = in_stack_fffffffffffff658;
    res1_12.low._0_8_ = in_stack_fffffffffffff650;
    res1_12.high._0_8_ = in_stack_fffffffffffff660;
    res1_12.high._8_8_ = in_stack_fffffffffffff668;
    res2_12.low._8_4_ = uVar11;
    res2_12.low._0_8_ = in_stack_fffffffffffff670;
    res2_12.low._12_4_ = iVar3;
    res2_12.high._0_8_ = poVar8;
    res2_12.high._8_8_ = poVar6;
    in_stack_fffffffffffff410 = paStack_7c0;
    anon_unknown.dwarf_6cf57::check_equal
              (in_stack_fffffffffffff640,in_stack_fffffffffffff638,res1_12,res2_12);
    std::__cxx11::string::~string(local_778);
    std::allocator<char>::~allocator(&local_779);
    dVar1 = (double)local_758;
    poVar9 = std::operator<<((ostream *)&std::cout,"\rTesting ");
    poVar9 = std::operator<<(poVar9,"pi_deleglise_rivat_parallel1(x) ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)(((dVar1 + 1.0) * 100.0) / 900.0));
    poVar9 = std::operator<<(poVar9,"%");
    std::ostream::operator<<(poVar9,std::flush<char,std::char_traits<char>>);
    local_758 = local_758 + 1;
    iVar4 = anon_unknown.dwarf_6cf57::get_rand();
    local_750 = iVar4 + local_750;
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"All tests passed successfully!");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  return true;
}

Assistant:

bool test()
{
  set_print(false); 
  srand(static_cast<unsigned>(time(0)));

  try
  {
#ifdef _OPENMP
    test_phi_thread_safety(100);
#endif

    CHECK_EQUAL(pi_lmo1,                         prime_sum_tiny,      CHECK_11,  50);
    CHECK_EQUAL(pi_lmo2,                         pi_lmo1,             CHECK_11,  100);
    CHECK_EQUAL(pi_lmo3,                         pi_lmo2,             CHECK_11,  300);
    CHECK_EQUAL(pi_lmo4,                         pi_lmo3,             CHECK_11,  400);
    CHECK_EQUAL(pi_lmo5,                         pi_lmo4,             CHECK_11,  600);
    CHECK_EQUAL(pi_lmo_parallel1,                pi_lmo5,             CHECK_21,  600);
    CHECK_EQUAL(pi_deleglise_rivat_parallel1,    pi_lmo_parallel1,    CHECK_22,  900);
  }
  catch (exception& e)
  {
    cerr << endl << e.what() << endl;
    return false;
  }

  cout << "All tests passed successfully!" << endl;
  return true;
}